

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_unres_depset(ly_ctx *ctx,lys_glob_unres *unres)

{
  long *plVar1;
  undefined8 *puVar2;
  lysc_ext *plVar3;
  lysc_unres_must *m_00;
  lysc_node_leaf *leaf;
  lysc_node *node_00;
  uint16_t oper;
  uint uVar4;
  LY_ERR LVar5;
  bool bVar6;
  uint local_1118;
  uint local_1114;
  uint32_t processed_leafrefs;
  uint32_t i;
  lysc_unres_dflt *d;
  lysc_unres_must *m;
  lysc_unres_when *w;
  lysc_unres_leafref *l;
  uint64_t v;
  ly_path *path;
  lys_depset_unres *ds_unres;
  lysc_ctx cctx;
  lysc_type_leafref *lref;
  lysc_type *typeiter;
  lysc_node *node;
  LY_ERR ret;
  lys_glob_unres *unres_local;
  ly_ctx *ctx_local;
  
  memset(&ds_unres,0,0x10a0);
  path = (ly_path *)&unres->ds_unres;
  local_1118 = 0;
  do {
    node._4_4_ = lys_compile_unres_depset_implement(ctx,unres);
    if (node._4_4_ != LY_SUCCESS) goto LAB_0016567b;
    while (*(int *)((long)&path[3].ext + 4) != 0) {
      uVar4 = *(int *)((long)&path[3].ext + 4) - 1;
      plVar1 = *(long **)(&(path[3].predicates)->type + (ulong)uVar4 * 2);
      ds_unres = *(lys_depset_unres **)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
      cctx.ctx = (ly_ctx *)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
      cctx.cur_mod = *(lys_module **)(*(long *)(*plVar1 + 8) + 0x50);
      cctx.pmod = (lysp_module *)plVar1[2];
      cctx.unres._0_4_ = 1;
      cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
      cctx._136_8_ = *(undefined8 *)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
      ly_log_location((lysc_node *)*plVar1,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      l = (lysc_unres_leafref *)0x0;
      while( true ) {
        bVar6 = false;
        if (node._4_4_ == LY_SUCCESS) {
          cctx._4248_8_ = lys_type_leafref_next((lysc_node *)*plVar1,(uint64_t *)&l);
          bVar6 = (lysc_type_leafref *)cctx._4248_8_ != (lysc_type_leafref *)0x0;
        }
        if (!bVar6) break;
        node._4_4_ = lys_compile_unres_leafref
                               ((lysc_ctx *)&ds_unres,(lysc_node *)*plVar1,
                                (lysc_type_leafref *)cctx._4248_8_,(lysp_module *)plVar1[1]);
      }
      ly_log_location_revert(1,0,0,0);
      if (node._4_4_ != LY_SUCCESS) goto LAB_0016567b;
      ly_set_rm_index((ly_set *)&path[3].ext,uVar4,free);
    }
    for (local_1114 = local_1118; local_1114 < *(uint *)((long)&path[1].ext + 4);
        local_1114 = local_1114 + 1) {
      plVar1 = *(long **)(&(path[1].predicates)->type + (ulong)local_1114 * 2);
      ds_unres = *(lys_depset_unres **)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
      cctx.ctx = (ly_ctx *)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
      cctx.cur_mod = *(lys_module **)(*(long *)(*plVar1 + 8) + 0x50);
      cctx.pmod = (lysp_module *)plVar1[2];
      cctx.unres._0_4_ = 1;
      cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
      cctx._136_8_ = *(undefined8 *)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
      ly_log_location((lysc_node *)*plVar1,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      l = (lysc_unres_leafref *)0x0;
      while( true ) {
        bVar6 = false;
        if (node._4_4_ == LY_SUCCESS) {
          cctx._4248_8_ = lys_type_leafref_next((lysc_node *)*plVar1,(uint64_t *)&l);
          bVar6 = (lysc_type_leafref *)cctx._4248_8_ != (lysc_type_leafref *)0x0;
        }
        if (!bVar6) break;
        node._4_4_ = lys_compile_unres_leafref
                               ((lysc_ctx *)&ds_unres,(lysc_node *)*plVar1,
                                (lysc_type_leafref *)cctx._4248_8_,(lysp_module *)plVar1[1]);
      }
      ly_log_location_revert(1,0,0,0);
      if (node._4_4_ != LY_SUCCESS) goto LAB_0016567b;
    }
    for (local_1114 = local_1118; local_1114 < *(uint *)((long)&path[1].ext + 4);
        local_1114 = local_1114 + 1) {
      puVar2 = *(undefined8 **)(&(path[1].predicates)->type + (ulong)local_1114 * 2);
      l = (lysc_unres_leafref *)0x0;
      while (cctx._4248_8_ = lys_type_leafref_next((lysc_node *)*puVar2,(uint64_t *)&l),
            (lysc_type_leafref *)cctx._4248_8_ != (lysc_type_leafref *)0x0) {
        for (lref = (lysc_type_leafref *)((lysc_type_leafref *)cctx._4248_8_)->realtype;
            lref->basetype == LY_TYPE_LEAFREF; lref = (lysc_type_leafref *)lref->realtype) {
        }
        lysc_type_free((lysf_ctx *)&cctx.path_len,((lysc_type_leafref *)cctx._4248_8_)->realtype);
        *(lysc_type_leafref **)(cctx._4248_8_ + 0x30) = lref;
        *(int *)(*(long *)(cctx._4248_8_ + 0x30) + 0x1c) =
             *(int *)(*(long *)(cctx._4248_8_ + 0x30) + 0x1c) + 1;
      }
      local_1118 = local_1118 + 1;
    }
    while (*(int *)((long)&path->node + 4) != 0) {
      uVar4 = *(int *)((long)&path->node + 4) - 1;
      plVar3 = (&path->ext->def)[uVar4];
      ds_unres = *(lys_depset_unres **)**(undefined8 **)(*(long *)(plVar3->name + 8) + 0x50);
      cctx.ctx = (ly_ctx *)**(undefined8 **)(*(long *)(plVar3->name + 8) + 0x50);
      cctx.cur_mod = *(lys_module **)(*(long *)(plVar3->name + 8) + 0x50);
      cctx.pmod = (lysp_module *)0x0;
      cctx.unres._0_4_ = 1;
      cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
      cctx._136_8_ = *(undefined8 *)**(undefined8 **)(*(long *)(plVar3->name + 8) + 0x50);
      ly_log_location((lysc_node *)plVar3->name,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      node._4_4_ = lys_compile_unres_when
                             ((lysc_ctx *)&ds_unres,(lysc_when *)plVar3->argname,
                              (lysc_node *)plVar3->name);
      ly_log_location_revert(1,0,0,0);
      if (node._4_4_ != LY_SUCCESS) goto LAB_0016567b;
      free(plVar3);
      ly_set_rm_index((ly_set *)path,uVar4,(_func_void_void_ptr *)0x0);
    }
    while (*(int *)((long)&path->predicates + 4) != 0) {
      uVar4 = *(int *)((long)&path->predicates + 4) - 1;
      m_00 = *(lysc_unres_must **)((path[1].node)->hash + (ulong)uVar4 * 8 + -4);
      ds_unres = (lys_depset_unres *)m_00->node->module->parsed->mod->ctx;
      cctx.ctx = (ly_ctx *)m_00->node->module->parsed->mod;
      cctx.cur_mod = (lys_module *)m_00->node->module->parsed;
      cctx.pmod = (lysp_module *)m_00->ext;
      cctx.unres._0_4_ = 1;
      cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
      cctx._136_8_ = m_00->node->module->parsed->mod->ctx;
      ly_log_location(m_00->node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      node._4_4_ = lys_compile_unres_must((lysc_ctx *)&ds_unres,m_00->node,m_00->local_mods);
      ly_log_location_revert(1,0,0,0);
      if (node._4_4_ != LY_SUCCESS) goto LAB_0016567b;
      lysc_unres_must_free(m_00);
      ly_set_rm_index((ly_set *)&path->predicates,uVar4,(_func_void_void_ptr *)0x0);
    }
    while (*(int *)((long)&path[4].node + 4) != 0) {
      uVar4 = *(int *)((long)&path[4].node + 4) - 1;
      leaf = (lysc_node_leaf *)(&(path[4].ext)->def)[uVar4];
      ds_unres = (lys_depset_unres *)((leaf->field_0).node.module)->parsed->mod->ctx;
      cctx.ctx = (ly_ctx *)((leaf->field_0).node.module)->parsed->mod;
      cctx.cur_mod = (lys_module *)((leaf->field_0).node.module)->parsed;
      cctx.pmod = (lysp_module *)0x0;
      cctx.unres._0_4_ = 1;
      cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
      cctx._136_8_ = ((leaf->field_0).node.module)->parsed->mod->ctx;
      ly_log_location((lysc_node *)leaf,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      node._4_4_ = lys_compile_unres_disabled_bitenum((lysc_ctx *)&ds_unres,leaf);
      ly_log_location_revert(1,0,0,0);
      if (node._4_4_ != LY_SUCCESS) goto LAB_0016567b;
      ly_set_rm_index((ly_set *)(path + 4),uVar4,(_func_void_void_ptr *)0x0);
    }
    while (*(int *)((long)&path[2].node + 4) != 0) {
      uVar4 = *(int *)((long)&path[2].node + 4) - 1;
      plVar3 = (&(path[2].ext)->def)[uVar4];
      ds_unres = (lys_depset_unres *)
                 ((((anon_union_8_2_5079c92f_for_lysc_unres_dflt_0 *)&plVar3->name)->leaf->field_0).
                  node.module)->parsed->mod->ctx;
      cctx.ctx = (ly_ctx *)
                 ((((anon_union_8_2_5079c92f_for_lysc_unres_dflt_0 *)&plVar3->name)->leaf->field_0).
                  node.module)->parsed->mod;
      cctx.cur_mod = (lys_module *)
                     ((((anon_union_8_2_5079c92f_for_lysc_unres_dflt_0 *)&plVar3->name)->leaf->
                      field_0).node.module)->parsed;
      cctx.pmod = (lysp_module *)0x0;
      cctx.unres._0_4_ = 1;
      cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
      cctx._136_8_ = ((((anon_union_8_2_5079c92f_for_lysc_unres_dflt_0 *)&plVar3->name)->leaf->
                      field_0).node.module)->parsed->mod->ctx;
      ly_log_location((lysc_node *)
                      ((anon_union_8_2_5079c92f_for_lysc_unres_dflt_0 *)&plVar3->name)->leaf,
                      (lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      if ((((anon_union_8_2_5079c92f_for_lysc_unres_dflt_0 *)&plVar3->name)->leaf->field_0).node.
          nodetype == 4) {
        node._4_4_ = lys_compile_unres_leaf_dlft
                               ((lysc_ctx *)&ds_unres,
                                ((anon_union_8_2_5079c92f_for_lysc_unres_dflt_0 *)&plVar3->name)->
                                leaf,(lysp_qname *)plVar3->argname,unres);
      }
      else {
        node._4_4_ = lys_compile_unres_llist_dflts
                               ((lysc_ctx *)&ds_unres,
                                ((anon_union_8_2_5079c92f_for_lysc_unres_dflt_0 *)&plVar3->name)->
                                llist,(lysp_qname *)plVar3->argname,(lysp_qname *)plVar3->exts,unres
                               );
      }
      ly_log_location_revert(1,0,0,0);
      if (node._4_4_ != LY_SUCCESS) goto LAB_0016567b;
      lysc_unres_dflt_free(ctx,(lysc_unres_dflt *)plVar3);
      ly_set_rm_index((ly_set *)(path + 2),uVar4,(_func_void_void_ptr *)0x0);
    }
  } while ((((local_1118 != *(uint *)((long)&path[1].ext + 4)) ||
            (*(int *)((long)&path[3].ext + 4) != 0)) || (*(int *)((long)&path->node + 4) != 0)) ||
          ((*(int *)((long)&path->predicates + 4) != 0 || (*(int *)((long)&path[2].node + 4) != 0)))
          );
  for (local_1114 = 0; local_1114 < *(uint *)((long)&path[2].predicates + 4);
      local_1114 = local_1114 + 1) {
    node_00 = *(lysc_node **)((path[3].node)->hash + (ulong)local_1114 * 8 + -4);
    node._4_4_ = lys_compile_unres_check_disabled(node_00);
    if (node._4_4_ != LY_SUCCESS) goto LAB_0016567b;
    ds_unres = (lys_depset_unres *)node_00->module->parsed->mod->ctx;
    cctx.ctx = (ly_ctx *)node_00->module->parsed->mod;
    cctx.cur_mod = (lys_module *)node_00->module->parsed;
    cctx.pmod = (lysp_module *)0x0;
    cctx.unres._0_4_ = 1;
    cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
    cctx._136_8_ = node_00->module->parsed->mod->ctx;
    lysc_node_free((lysf_ctx *)&cctx.path_len,node_00,'\x01');
  }
  for (local_1114 = 0; local_1114 < *(uint *)((long)&path[1].ext + 4); local_1114 = local_1114 + 1)
  {
    plVar1 = *(long **)(&(path[1].predicates)->type + (ulong)local_1114 * 2);
    ds_unres = *(lys_depset_unres **)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
    cctx.ctx = (ly_ctx *)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
    cctx.cur_mod = *(lys_module **)(*(long *)(*plVar1 + 8) + 0x50);
    cctx.pmod = (lysp_module *)plVar1[2];
    cctx.unres._0_4_ = 1;
    cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
    cctx._136_8_ = *(undefined8 *)**(undefined8 **)(*(long *)(*plVar1 + 8) + 0x50);
    l = (lysc_unres_leafref *)0x0;
    while (cctx._4248_8_ = lys_type_leafref_next((lysc_node *)*plVar1,(uint64_t *)&l),
          (lysc_type_leafref *)cctx._4248_8_ != (lysc_type_leafref *)0x0) {
      oper = 1;
      if ((*(ushort *)(*plVar1 + 2) & 0x2000) != 0) {
        oper = 2;
      }
      LVar5 = ly_path_compile_leafref
                        ((ly_ctx *)ds_unres,(lysc_node *)*plVar1,(lysc_ext_instance *)cctx.pmod,
                         ((lysc_type_leafref *)cctx._4248_8_)->path,oper,0x20,
                         LY_VALUE_SCHEMA_RESOLVED,((lysc_type_leafref *)cctx._4248_8_)->prefixes,
                         (ly_path **)&v);
      ly_path_free((ly_path *)v);
      if (LVar5 == LY_ERECOMPILE) {
        __assert_fail("ret != LY_ERECOMPILE",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                      ,0x5b9,
                      "LY_ERR lys_compile_unres_depset(struct ly_ctx *, struct lys_glob_unres *)");
      }
      if (LVar5 != LY_SUCCESS) {
        ly_log_location((lysc_node *)*plVar1,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                "Target of leafref \"%s\" cannot be referenced because it is disabled.",
                *(undefined8 *)(*plVar1 + 0x28));
        ly_log_location_revert(1,0,0,0);
        node._4_4_ = LY_EVALID;
        goto LAB_0016567b;
      }
      node._4_4_ = LY_SUCCESS;
    }
  }
LAB_0016567b:
  if (cctx.free_ctx.mod._4_4_ != 0) {
    __assert_fail("!cctx.free_ctx.ext_set.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x5c6,"LY_ERR lys_compile_unres_depset(struct ly_ctx *, struct lys_glob_unres *)"
                 );
  }
  return node._4_4_;
}

Assistant:

static LY_ERR
lys_compile_unres_depset(struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_node *node;
    struct lysc_type *typeiter;
    struct lysc_type_leafref *lref;
    struct lysc_ctx cctx = {0};
    struct lys_depset_unres *ds_unres = &unres->ds_unres;
    struct ly_path *path;
    LY_ARRAY_COUNT_TYPE v;
    struct lysc_unres_leafref *l;
    struct lysc_unres_when *w;
    struct lysc_unres_must *m;
    struct lysc_unres_dflt *d;
    uint32_t i, processed_leafrefs = 0;

resolve_all:
    /* implement all referenced modules to get final ds_unres set */
    if ((ret = lys_compile_unres_depset_implement(ctx, unres))) {
        goto cleanup;
    }

    /* check disabled leafrefs */
    while (ds_unres->disabled_leafrefs.count) {
        /* remember index, it can change before we get to free this item */
        i = ds_unres->disabled_leafrefs.count - 1;
        l = ds_unres->disabled_leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        LOG_LOCSET(l->node, NULL);
        v = 0;
        while ((ret == LY_SUCCESS) && (lref = lys_type_leafref_next(l->node, &v))) {
            ret = lys_compile_unres_leafref(&cctx, l->node, lref, l->local_mod);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        ly_set_rm_index(&ds_unres->disabled_leafrefs, i, free);
    }

    /* for leafref, we need 2 rounds - first detects circular chain by storing the first referred type (which
     * can be also leafref, in case it is already resolved, go through the chain and check that it does not
     * point to the starting leafref type). The second round stores the first non-leafref type for later data validation.
     * Also do the same check for set of the disabled leafrefs, but without the second round. */
    for (i = processed_leafrefs; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        LOG_LOCSET(l->node, NULL);
        v = 0;
        while ((ret == LY_SUCCESS) && (lref = lys_type_leafref_next(l->node, &v))) {
            ret = lys_compile_unres_leafref(&cctx, l->node, lref, l->local_mod);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);
    }
    for (i = processed_leafrefs; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];

        /* store pointer to the real type */
        v = 0;
        while ((lref = lys_type_leafref_next(l->node, &v))) {
            for (typeiter = lref->realtype;
                    typeiter->basetype == LY_TYPE_LEAFREF;
                    typeiter = ((struct lysc_type_leafref *)typeiter)->realtype) {}

            lysc_type_free(&cctx.free_ctx, lref->realtype);
            lref->realtype = typeiter;
            ++lref->realtype->refcount;
        }

        /* if 'goto' will be used on the 'resolve_all' label, then the current leafref will not be processed again */
        processed_leafrefs++;
    }

    /* check when, the referenced modules must be implemented now */
    while (ds_unres->whens.count) {
        i = ds_unres->whens.count - 1;
        w = ds_unres->whens.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, w->node->module->parsed, NULL);

        LOG_LOCSET(w->node, NULL);
        ret = lys_compile_unres_when(&cctx, w->when, w->node);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        free(w);
        ly_set_rm_index(&ds_unres->whens, i, NULL);
    }

    /* check must */
    while (ds_unres->musts.count) {
        i = ds_unres->musts.count - 1;
        m = ds_unres->musts.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, m->node->module->parsed, m->ext);

        LOG_LOCSET(m->node, NULL);
        ret = lys_compile_unres_must(&cctx, m->node, m->local_mods);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        lysc_unres_must_free(m);
        ly_set_rm_index(&ds_unres->musts, i, NULL);
    }

    /* remove disabled enums/bits */
    while (ds_unres->disabled_bitenums.count) {
        i = ds_unres->disabled_bitenums.count - 1;
        node = ds_unres->disabled_bitenums.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, node->module->parsed, NULL);

        LOG_LOCSET(node, NULL);
        ret = lys_compile_unres_disabled_bitenum(&cctx, (struct lysc_node_leaf *)node);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        ly_set_rm_index(&ds_unres->disabled_bitenums, i, NULL);
    }

    /* finish incomplete default values compilation */
    while (ds_unres->dflts.count) {
        i = ds_unres->dflts.count - 1;
        d = ds_unres->dflts.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, d->leaf->module->parsed, NULL);

        LOG_LOCSET(&d->leaf->node, NULL);
        if (d->leaf->nodetype == LYS_LEAF) {
            ret = lys_compile_unres_leaf_dlft(&cctx, d->leaf, d->dflt, unres);
        } else {
            ret = lys_compile_unres_llist_dflts(&cctx, d->llist, d->dflt, d->dflts, unres);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        lysc_unres_dflt_free(ctx, d);
        ly_set_rm_index(&ds_unres->dflts, i, NULL);
    }

    /* some unres items may have been added by the default values */
    if ((processed_leafrefs != ds_unres->leafrefs.count) || ds_unres->disabled_leafrefs.count ||
            ds_unres->whens.count || ds_unres->musts.count || ds_unres->dflts.count) {
        goto resolve_all;
    }

    /* finally, remove all disabled nodes */
    for (i = 0; i < ds_unres->disabled.count; ++i) {
        node = ds_unres->disabled.snodes[i];
        ret = lys_compile_unres_check_disabled(node);
        LY_CHECK_GOTO(ret, cleanup);

        LYSC_CTX_INIT_PMOD(cctx, node->module->parsed, NULL);

        lysc_node_free(&cctx.free_ctx, node, 1);
    }

    /* also check if the leafref target has not been disabled */
    for (i = 0; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        v = 0;
        while ((lref = lys_type_leafref_next(l->node, &v))) {
            ret = ly_path_compile_leafref(cctx.ctx, l->node, cctx.ext, lref->path,
                    (l->node->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY,
                    LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &path);
            ly_path_free(path);

            assert(ret != LY_ERECOMPILE);
            if (ret) {
                LOG_LOCSET(l->node, NULL);
                LOGVAL(ctx, LYVE_REFERENCE, "Target of leafref \"%s\" cannot be referenced because it is disabled.",
                        l->node->name);
                LOG_LOCBACK(1, 0);
                ret = LY_EVALID;
                goto cleanup;
            }
        }
    }

cleanup:
    assert(!cctx.free_ctx.ext_set.count);
    return ret;
}